

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDF_linearization.cc
# Opt level: O2

void __thiscall QPDF::checkHOutlines(QPDF *this)

{
  int __val;
  bool bVar1;
  int iVar2;
  size_type sVar3;
  qpdf_offset_t __val_00;
  qpdf_offset_t qVar4;
  _Head_base<0UL,_QPDF::Members_*,_false> _Var5;
  char *pcVar6;
  long __val_01;
  string_view msg;
  string_view msg_00;
  string_view msg_01;
  string_view msg_02;
  size_t sStack_100;
  string local_f8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d8;
  QPDFObjectHandle outlines;
  ObjUser ou;
  string local_80;
  string local_60;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40;
  QPDFObjGen og;
  
  _Var5._M_head_impl =
       (this->m)._M_t.super___uniq_ptr_impl<QPDF::Members,_std::default_delete<QPDF::Members>_>._M_t
       .super__Tuple_impl<0UL,_QPDF::Members_*,_std::default_delete<QPDF::Members>_>.
       super__Head_base<0UL,_QPDF::Members_*,_false>._M_head_impl;
  iVar2 = *(int *)((long)&(_Var5._M_head_impl)->c_outline_data + 0x10);
  if (iVar2 != *(int *)((long)&(_Var5._M_head_impl)->outline_hints + 0x10)) {
    pcVar6 = "incorrect object count in outline hint table";
    sStack_100 = 0x2c;
LAB_001d629b:
    msg_01._M_str = pcVar6;
    msg_01._M_len = sStack_100;
    linearizationWarning(this,msg_01);
    return;
  }
  if (iVar2 != 0) {
    if (((_Var5._M_head_impl)->c_outline_data).first_object !=
        ((_Var5._M_head_impl)->outline_hints).first_object) {
      pcVar6 = "incorrect first object number in outline hints table.";
      sStack_100 = 0x35;
      goto LAB_001d629b;
    }
    getRoot((QPDF *)&local_f8);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&ou,"/Outlines",(allocator<char> *)&local_d8);
    QPDFObjectHandle::getKey(&outlines,&local_f8);
    std::__cxx11::string::~string((string *)&ou);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_f8._M_string_length);
    bVar1 = QPDFObjectHandle::isIndirect(&outlines);
    if (bVar1) {
      og = QPDFObjectHandle::getObjGen(&outlines);
      sVar3 = std::
              map<QPDFObjGen,_QPDFXRefEntry,_std::less<QPDFObjGen>,_std::allocator<std::pair<const_QPDFObjGen,_QPDFXRefEntry>_>_>
              ::count(&((this->m)._M_t.
                        super___uniq_ptr_impl<QPDF::Members,_std::default_delete<QPDF::Members>_>.
                        _M_t.
                        super__Tuple_impl<0UL,_QPDF::Members_*,_std::default_delete<QPDF::Members>_>
                        .super__Head_base<0UL,_QPDF::Members_*,_false>._M_head_impl)->xref_table,&og
                     );
      if (sVar3 == 0) {
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&ou,"unknown object in outlines hint table",
                   (allocator<char> *)&local_f8);
        stopOnError(this,(string *)&ou);
        std::__cxx11::string::~string((string *)&ou);
      }
      __val_00 = getLinearizationOffset(this,og);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_f8,"/Outlines",(allocator<char> *)&local_d8);
      ObjUser::ObjUser(&ou,ou_root_key,&local_f8);
      std::__cxx11::string::~string((string *)&local_f8);
      qVar4 = maxEnd(this,&ou);
      local_f8._M_dataplus._M_p = (pointer)(qVar4 - __val_00);
      iVar2 = QIntC::IntConverter<long_long,_int,_true,_true>::convert((longlong *)&local_f8);
      _Var5._M_head_impl =
           (this->m)._M_t.super___uniq_ptr_impl<QPDF::Members,_std::default_delete<QPDF::Members>_>.
           _M_t.super__Tuple_impl<0UL,_QPDF::Members_*,_std::default_delete<QPDF::Members>_>.
           super__Head_base<0UL,_QPDF::Members_*,_false>._M_head_impl;
      __val_01 = *(qpdf_offset_t *)((long)&(_Var5._M_head_impl)->outline_hints + 8);
      if (*(qpdf_offset_t *)((long)&(_Var5._M_head_impl)->linp + 0x30) <= __val_01) {
        __val_01 = __val_01 + *(qpdf_offset_t *)((long)&(_Var5._M_head_impl)->linp + 0x38);
      }
      if (__val_00 != __val_01) {
        std::__cxx11::to_string(&local_60,__val_01);
        std::operator+(&local_40,"incorrect offset in outlines table: hint table = ",&local_60);
        std::operator+(&local_d8,&local_40,"; computed = ");
        std::__cxx11::to_string(&local_80,__val_00);
        std::operator+(&local_f8,&local_d8,&local_80);
        msg._M_str = local_f8._M_dataplus._M_p;
        msg._M_len = local_f8._M_string_length;
        linearizationWarning(this,msg);
        std::__cxx11::string::~string((string *)&local_f8);
        std::__cxx11::string::~string((string *)&local_80);
        std::__cxx11::string::~string((string *)&local_d8);
        std::__cxx11::string::~string((string *)&local_40);
        std::__cxx11::string::~string((string *)&local_60);
        _Var5._M_head_impl =
             (this->m)._M_t.
             super___uniq_ptr_impl<QPDF::Members,_std::default_delete<QPDF::Members>_>._M_t.
             super__Tuple_impl<0UL,_QPDF::Members_*,_std::default_delete<QPDF::Members>_>.
             super__Head_base<0UL,_QPDF::Members_*,_false>._M_head_impl;
      }
      __val = ((_Var5._M_head_impl)->outline_hints).group_length;
      if (iVar2 != __val) {
        std::__cxx11::to_string(&local_60,__val);
        std::operator+(&local_40,"incorrect length in outlines table: hint table = ",&local_60);
        std::operator+(&local_d8,&local_40,"; computed = ");
        std::__cxx11::to_string(&local_80,iVar2);
        std::operator+(&local_f8,&local_d8,&local_80);
        msg_00._M_str = local_f8._M_dataplus._M_p;
        msg_00._M_len = local_f8._M_string_length;
        linearizationWarning(this,msg_00);
        std::__cxx11::string::~string((string *)&local_f8);
        std::__cxx11::string::~string((string *)&local_80);
        std::__cxx11::string::~string((string *)&local_d8);
        std::__cxx11::string::~string((string *)&local_40);
        std::__cxx11::string::~string((string *)&local_60);
      }
      std::__cxx11::string::~string((string *)&ou.key);
    }
    else {
      msg_02._M_str = "/Outlines key of root dictionary is not indirect";
      msg_02._M_len = 0x30;
      linearizationWarning(this,msg_02);
    }
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&outlines.super_BaseHandle.obj.
                super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  }
  return;
}

Assistant:

void
QPDF::checkHOutlines()
{
    // Empirically, Acrobat generates the correct value for the object number but incorrectly stores
    // the next object number's offset as the offset, at least when outlines appear in part 6.  It
    // also generates an incorrect value for length (specifically, the length that would cover the
    // correct number of objects from the wrong starting place).  pdlin appears to generate correct
    // values in those cases.

    if (m->c_outline_data.nobjects == m->outline_hints.nobjects) {
        if (m->c_outline_data.nobjects == 0) {
            return;
        }

        if (m->c_outline_data.first_object == m->outline_hints.first_object) {
            // Check length and offset.  Acrobat gets these wrong.
            QPDFObjectHandle outlines = getRoot().getKey("/Outlines");
            if (!outlines.isIndirect()) {
                // This case is not exercised in test suite since not permitted by the spec, but if
                // this does occur, the code below would fail.
                linearizationWarning("/Outlines key of root dictionary is not indirect");
                return;
            }
            QPDFObjGen og(outlines.getObjGen());
            if (m->xref_table.count(og) == 0) {
                stopOnError("unknown object in outlines hint table");
            }
            qpdf_offset_t offset = getLinearizationOffset(og);
            ObjUser ou(ObjUser::ou_root_key, "/Outlines");
            int length = toI(maxEnd(ou) - offset);
            qpdf_offset_t table_offset = adjusted_offset(m->outline_hints.first_object_offset);
            if (offset != table_offset) {
                linearizationWarning(
                    "incorrect offset in outlines table: hint table = " +
                    std::to_string(table_offset) + "; computed = " + std::to_string(offset));
            }
            int table_length = m->outline_hints.group_length;
            if (length != table_length) {
                linearizationWarning(
                    "incorrect length in outlines table: hint table = " +
                    std::to_string(table_length) + "; computed = " + std::to_string(length));
            }
        } else {
            linearizationWarning("incorrect first object number in outline hints table.");
        }
    } else {
        linearizationWarning("incorrect object count in outline hint table");
    }
}